

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

bool __thiscall
GameBoard::checkDirectDropTo(GameBoard *this,int color,int blockType,int x,int y,int o)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  char cVar6;
  
  bVar2 = 0x14 < x;
  if (x < 0x15) {
    do {
      lVar3 = 0;
      do {
        uVar4 = blockShape[blockType][o][lVar3 * 2] + x;
        cVar6 = '\a';
        if ((((int)uVar4 < 0x15) && (cVar6 = '\x01', 0 < (int)uVar4)) &&
           (uVar5 = *(int *)((long)o * 0x20 + (long)blockType * 0x80 + 0x11af44 + lVar3 * 8) + y,
           0xfffffff5 < uVar5 - 0xb)) {
          cVar6 = this->gridInfo[color][uVar4][uVar5] != 0;
        }
        if ((cVar6 != '\a') && (cVar6 != '\0')) {
          return bVar2;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      iVar1 = x + 1;
      bVar2 = 0x13 < x;
      x = iVar1;
    } while (iVar1 != 0x15);
  }
  return bVar2;
}

Assistant:

bool GameBoard::checkDirectDropTo(int color, int blockType, int x, int y, int o)
{
    auto &def = blockShape[blockType][o];
    for (; x <= MAPHEIGHT; x++)
        for (int i = 0; i < 4; i++) {
            int _x = def[i * 2] + x, _y = def[i * 2 + 1] + y;
            if (_x > MAPHEIGHT)
                continue;
            if (_x < 1 || _y < 1 || _y > MAPWIDTH || gridInfo[color][_x][_y])
                return false;
        }
    return true;
}